

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_priority_deque.cpp
# Opt level: O3

void __thiscall priority_deque_iterator::test_method(priority_deque_iterator *this)

{
  int iVar1;
  int iVar2;
  int pushed;
  multiset<int,_std::less<int>,_std::allocator<int>_> existing_elements;
  priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> pd;
  value_expr<bool> local_165;
  int local_164;
  char *local_160;
  char *local_158;
  undefined **local_150;
  undefined1 local_148;
  shared_count local_140;
  char **local_138;
  assertion_result local_130;
  lazy_ostream local_118;
  undefined1 *local_108;
  bool *local_100;
  bool *local_f8;
  undefined8 local_f0;
  priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> local_e8;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_164 = 1;
  do {
    local_e8.sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_e8.sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_e8.sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_70.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
    ;
    local_70.m_end = "";
    local_80.m_begin = "";
    local_80.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x11d,&local_80);
    local_160 = (char *)CONCAT71(local_160._1_7_,
                                 local_e8.sequence_.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start ==
                                 local_e8.sequence_.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)&local_150,(value_expr<bool> *)&local_160,false);
    local_100 = (bool *)&local_130;
    local_130._0_8_ = "(pd.begin() == pd.end())";
    local_130.m_message.px = (element_type *)0x1a3ef9;
    local_118._8_4_ = local_118._8_4_ & 0xffffff00;
    local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001c1ca8;
    local_108 = boost::unit_test::lazy_ostream::inst;
    local_90.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
    ;
    local_90.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_150,&local_118,&local_90,0x11d,REQUIRE,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_140);
    local_118._8_4_ = 0;
    local_108 = (undefined1 *)0x0;
    local_100 = &local_118.m_empty;
    local_f0 = 0;
    iVar2 = local_164;
    local_f8 = local_100;
    do {
      iVar1 = rand();
      local_150 = (undefined **)CONCAT44(local_150._4_4_,iVar1);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_equal<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_118,(int *)&local_150);
      boost::container::priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>
      ::push(&local_e8,(value_type *)&local_150);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    local_a0.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
    ;
    local_a0.m_end = "";
    local_b0.m_begin = "";
    local_b0.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x127,&local_b0);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_60,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &local_118);
    local_165.m_value =
         (anonymous_namespace)::
         have_same_elements<boost::container::priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>>,int>
                   (&local_e8,(multiset<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_130,&local_165,false);
    local_160 = "have_same_elements(pd, existing_elements)";
    local_158 = "";
    local_148 = 0;
    local_150 = &PTR__lazy_ostream_001c1ca8;
    local_140.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_138 = &local_160;
    local_c0.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
    ;
    local_c0.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_130,(lazy_ostream *)&local_150,&local_c0,0x127,REQUIRE,CHECK_BUILT_ASSERTION,0
              );
    boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &local_118);
    if (local_e8.sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_164 = local_164 + 1;
  } while (local_164 != 8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( priority_deque_iterator )
{
  using namespace boost::container;
  for (int push_count = 1; push_count < 8; ++push_count)
  {
    priority_deque<int> pd;
    BOOST_TEST_REQUIRE((pd.begin() == pd.end()));

    std::multiset<int> existing_elements;
    for (int i = 0; i < push_count; ++i)
    {
      int pushed = rand();
      existing_elements.insert(pushed);
      pd.push(pushed);
    }

    BOOST_TEST_REQUIRE(have_same_elements(pd, existing_elements));
  }
}